

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall duckdb::VersionDeleteState::Delete(VersionDeleteState *this,row_t row_id)

{
  idx_t iVar1;
  
  if (this->current_chunk != (ulong)row_id >> 0xb) {
    Flush(this);
    this->current_chunk = (ulong)row_id >> 0xb;
    this->chunk_row = row_id & 0xfffffffffffff800;
  }
  iVar1 = this->count;
  this->count = iVar1 + 1;
  this->rows[iVar1] = (ulong)((uint)row_id & 0x7ff);
  return;
}

Assistant:

void VersionDeleteState::Delete(row_t row_id) {
	D_ASSERT(row_id >= 0);
	idx_t vector_idx = UnsafeNumericCast<idx_t>(row_id) / STANDARD_VECTOR_SIZE;
	idx_t idx_in_vector = UnsafeNumericCast<idx_t>(row_id) - vector_idx * STANDARD_VECTOR_SIZE;
	if (current_chunk != vector_idx) {
		Flush();

		current_chunk = vector_idx;
		chunk_row = vector_idx * STANDARD_VECTOR_SIZE;
	}
	rows[count++] = UnsafeNumericCast<row_t>(idx_in_vector);
}